

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRST.cxx
# Opt level: O0

void __thiscall cmRST::ProcessModule(cmRST *this,istream *is)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  string_view str;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  string_view local_a8;
  allocator<char> local_91;
  string local_90;
  long local_70;
  size_type pos;
  undefined1 local_58 [8];
  string rst;
  string line;
  istream *is_local;
  cmRST *this_local;
  
  std::__cxx11::string::string((string *)(rst.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_58);
LAB_00398640:
  do {
    bVar1 = cmsys::SystemTools::GetLineFromStream
                      (is,(string *)((long)&rst.field_2 + 8),(bool *)0x0,0xffffffffffffffff);
    if (!bVar1) {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_58,"#");
      if (bVar1) {
        Reset(this);
      }
      std::__cxx11::string::~string((string *)local_58);
      std::__cxx11::string::~string((string *)(rst.field_2._M_local_buf + 8));
      return;
    }
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_58,"#");
      if (bVar1) {
        local_70 = std::__cxx11::string::find
                             ((string *)(rst.field_2._M_local_buf + 8),(ulong)local_58);
        if (local_70 == -1) {
          ProcessLine(this,(string *)((long)&rst.field_2 + 8));
        }
        else {
          pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)((long)&rst.field_2 + 8));
          if (*pcVar3 != '#') {
            std::__cxx11::string::resize((ulong)((long)&rst.field_2 + 8));
            ProcessLine(this,(string *)((long)&rst.field_2 + 8));
          }
          std::__cxx11::string::clear();
          Reset(this);
          this->OutputLinePending = true;
        }
        goto LAB_00398640;
      }
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_58,"#");
    if (bVar1) {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&rst.field_2 + 8),"#");
      if (bVar1) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"",&local_91);
        ProcessLine(this,&local_90);
        std::__cxx11::string::~string((string *)&local_90);
        std::allocator<char>::~allocator(&local_91);
      }
      else {
        str = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view
                        ((string *)(rst.field_2._M_local_buf + 8));
        local_a8 = str;
        bVar1 = cmHasLiteralPrefix<3ul>(str,(char (*) [3])0xc7beab);
        if (!bVar1) {
          std::__cxx11::string::clear();
          Reset(this);
          this->OutputLinePending = true;
          goto LAB_003988cf;
        }
        std::__cxx11::string::erase((ulong)((long)&rst.field_2 + 8),0);
        ProcessLine(this,(string *)((long)&rst.field_2 + 8));
      }
    }
    else {
LAB_003988cf:
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&rst.field_2 + 8),"#.rst:");
      if (bVar1) {
        std::__cxx11::string::operator=((string *)local_58,"#");
      }
      else {
        bVar1 = cmsys::RegularExpression::find(&this->ModuleRST,(string *)((long)&rst.field_2 + 8));
        if (bVar1) {
          cmsys::RegularExpression::match_abi_cxx11_(&local_108,&this->ModuleRST,1);
          std::operator+(&local_e8,"]",&local_108);
          std::operator+(&local_c8,&local_e8,"]");
          std::__cxx11::string::operator=((string *)local_58,(string *)&local_c8);
          std::__cxx11::string::~string((string *)&local_c8);
          std::__cxx11::string::~string((string *)&local_e8);
          std::__cxx11::string::~string((string *)&local_108);
        }
      }
    }
  } while( true );
}

Assistant:

void cmRST::ProcessModule(std::istream& is)
{
  std::string line;
  std::string rst;
  while (cmSystemTools::GetLineFromStream(is, line)) {
    if (!rst.empty() && rst != "#") {
      // Bracket mode: check for end bracket
      std::string::size_type pos = line.find(rst);
      if (pos == std::string::npos) {
        this->ProcessLine(line);
      } else {
        if (line[0] != '#') {
          line.resize(pos);
          this->ProcessLine(line);
        }
        rst.clear();
        this->Reset();
        this->OutputLinePending = true;
      }
    } else {
      // Line mode: check for .rst start (bracket or line)
      if (rst == "#") {
        if (line == "#") {
          this->ProcessLine("");
          continue;
        }
        if (cmHasLiteralPrefix(line, "# ")) {
          line.erase(0, 2);
          this->ProcessLine(line);
          continue;
        }
        rst.clear();
        this->Reset();
        this->OutputLinePending = true;
      }
      if (line == "#.rst:") {
        rst = "#";
      } else if (this->ModuleRST.find(line)) {
        rst = "]" + this->ModuleRST.match(1) + "]";
      }
    }
  }
  if (rst == "#") {
    this->Reset();
  }
}